

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O0

void __thiscall ChaCha20::Crypt(ChaCha20 *this,Span<const_std::byte> input,Span<std::byte> output)

{
  byte bVar1;
  byte bVar2;
  unsigned_long uVar3;
  Span<std::byte> output_00;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  unsigned_long *puVar7;
  byte *pbVar8;
  reference pvVar9;
  ulong pos;
  ChaCha20Aligned *in_RCX;
  byte *in_RDX;
  byte *in_RSI;
  Span<std::byte> *in_RDI;
  byte *in_R8;
  long in_FS_OFFSET;
  Span<std::byte> SVar10;
  Span<const_std::byte> SVar11;
  uint i_1;
  size_t blocks;
  uint i;
  uint reuse;
  undefined6 in_stack_fffffffffffffef8;
  byte in_stack_fffffffffffffefe;
  byte in_stack_fffffffffffffeff;
  array<std::byte,_64UL> *in_stack_ffffffffffffff00;
  Span<const_std::byte> *in_stack_ffffffffffffff08;
  Span<std::byte> *this_00;
  uint local_cc;
  uint local_a0;
  ChaCha20Aligned *in_stack_ffffffffffffff88;
  byte *in_stack_ffffffffffffff90;
  byte *in_stack_ffffffffffffff98;
  byte *local_58;
  byte *local_50;
  ChaCha20Aligned *local_48;
  byte *local_40;
  size_t sVar12;
  
  sVar12 = *(size_t *)(in_FS_OFFSET + 0x28);
  sVar5 = Span<const_std::byte>::size
                    ((Span<const_std::byte> *)
                     CONCAT17(in_stack_fffffffffffffeff,
                              CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  sVar6 = Span<std::byte>::size
                    ((Span<std::byte> *)
                     CONCAT17(in_stack_fffffffffffffeff,
                              CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  if (sVar5 != sVar6) {
    __assert_fail("input.size() == output.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0x131,"void ChaCha20::Crypt(Span<const std::byte>, Span<std::byte>)");
  }
  sVar5 = Span<const_std::byte>::size
                    ((Span<const_std::byte> *)
                     CONCAT17(in_stack_fffffffffffffeff,
                              CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  if (sVar5 != 0) {
    if (*(int *)&in_RDI[7].m_data != 0) {
      Span<const_std::byte>::size
                ((Span<const_std::byte> *)
                 CONCAT17(in_stack_fffffffffffffeff,
                          CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
      puVar7 = std::min<unsigned_long>
                         ((unsigned_long *)in_stack_ffffffffffffff00,
                          (unsigned_long *)
                          CONCAT17(in_stack_fffffffffffffeff,
                                   CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
      uVar3 = *puVar7;
      for (local_a0 = 0; local_a0 < (uint)uVar3; local_a0 = local_a0 + 1) {
        pbVar8 = Span<const_std::byte>::operator[]
                           (in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
        bVar1 = *pbVar8;
        pvVar9 = std::array<std::byte,_64UL>::operator[]
                           ((array<std::byte,_64UL> *)in_stack_ffffffffffffff08,
                            (size_type)in_stack_ffffffffffffff00);
        bVar2 = *pvVar9;
        pbVar8 = Span<std::byte>::operator[]
                           ((Span<std::byte> *)in_stack_ffffffffffffff08,
                            (size_t)in_stack_ffffffffffffff00);
        *pbVar8 = bVar1 ^ bVar2;
      }
      *(uint *)&in_RDI[7].m_data = *(int *)&in_RDI[7].m_data - (uint)uVar3;
      SVar10 = Span<std::byte>::subspan
                         ((Span<std::byte> *)in_stack_ffffffffffffff08,
                          (size_t)in_stack_ffffffffffffff00);
      local_48 = (ChaCha20Aligned *)SVar10.m_data;
      local_40 = (byte *)SVar10.m_size;
      SVar11 = Span<const_std::byte>::subspan
                         (in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
      local_58 = SVar11.m_data;
      local_50 = (byte *)SVar11.m_size;
      in_RCX = local_48;
      in_R8 = local_40;
      in_RSI = local_58;
      in_RDX = local_50;
    }
    sVar5 = Span<const_std::byte>::size
                      ((Span<const_std::byte> *)
                       CONCAT17(in_stack_fffffffffffffeff,
                                CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
    if (0x3f < sVar5) {
      Span<const_std::byte>::size
                ((Span<const_std::byte> *)
                 CONCAT17(in_stack_fffffffffffffeff,
                          CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
      Span<const_std::byte>::first(in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
      Span<std::byte>::first
                ((Span<std::byte> *)in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
      SVar11.m_size = sVar12;
      SVar11.m_data = in_RDX;
      SVar10.m_size = (size_t)in_RSI;
      SVar10.m_data = in_R8;
      ChaCha20Aligned::Crypt(in_RCX,SVar11,SVar10);
      SVar10 = Span<std::byte>::subspan
                         ((Span<std::byte> *)in_stack_ffffffffffffff08,
                          (size_t)in_stack_ffffffffffffff00);
      in_stack_ffffffffffffff98 = SVar10.m_data;
      SVar11 = Span<const_std::byte>::subspan
                         (in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
      in_stack_ffffffffffffff88 = (ChaCha20Aligned *)SVar11.m_data;
      in_stack_ffffffffffffff90 = (byte *)SVar11.m_size;
    }
    bVar4 = Span<const_std::byte>::empty
                      ((Span<const_std::byte> *)
                       CONCAT17(in_stack_fffffffffffffeff,
                                CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
    if (!bVar4) {
      this_00 = in_RDI;
      Span<std::byte>::Span<std::array<std::byte,64ul>>
                (in_RDI,in_stack_ffffffffffffff00,
                 (type)CONCAT17(in_stack_fffffffffffffeff,
                                CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
      output_00.m_size = (size_t)in_stack_ffffffffffffff98;
      output_00.m_data = in_stack_ffffffffffffff90;
      ChaCha20Aligned::Keystream(in_stack_ffffffffffffff88,output_00);
      local_cc = 0;
      while( true ) {
        pos = (ulong)local_cc;
        sVar5 = Span<const_std::byte>::size
                          ((Span<const_std::byte> *)
                           CONCAT17(in_stack_fffffffffffffeff,
                                    CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
        if (sVar5 <= pos) break;
        pbVar8 = Span<const_std::byte>::operator[]((Span<const_std::byte> *)this_00,pos);
        in_stack_fffffffffffffefe = *pbVar8;
        pvVar9 = std::array<std::byte,_64UL>::operator[]((array<std::byte,_64UL> *)this_00,pos);
        in_stack_fffffffffffffeff = in_stack_fffffffffffffefe ^ *pvVar9;
        pbVar8 = Span<std::byte>::operator[](this_00,pos);
        *pbVar8 = in_stack_fffffffffffffeff;
        local_cc = local_cc + 1;
      }
      sVar5 = Span<const_std::byte>::size
                        ((Span<const_std::byte> *)
                         CONCAT17(in_stack_fffffffffffffeff,
                                  CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
      *(int *)&in_RDI[7].m_data = 0x40 - (int)sVar5;
    }
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) != sVar12) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ChaCha20::Crypt(Span<const std::byte> input, Span<std::byte> output) noexcept
{
    assert(input.size() == output.size());

    if (!input.size()) return;
    if (m_bufleft) {
        unsigned reuse = std::min<size_t>(m_bufleft, input.size());
        for (unsigned i = 0; i < reuse; i++) {
            output[i] = input[i] ^ m_buffer[m_aligned.BLOCKLEN - m_bufleft + i];
        }
        m_bufleft -= reuse;
        output = output.subspan(reuse);
        input = input.subspan(reuse);
    }
    if (input.size() >= m_aligned.BLOCKLEN) {
        size_t blocks = input.size() / m_aligned.BLOCKLEN;
        m_aligned.Crypt(input.first(blocks * m_aligned.BLOCKLEN), output.first(blocks * m_aligned.BLOCKLEN));
        output = output.subspan(blocks * m_aligned.BLOCKLEN);
        input = input.subspan(blocks * m_aligned.BLOCKLEN);
    }
    if (!input.empty()) {
        m_aligned.Keystream(m_buffer);
        for (unsigned i = 0; i < input.size(); i++) {
            output[i] = input[i] ^ m_buffer[i];
        }
        m_bufleft = m_aligned.BLOCKLEN - input.size();
    }
}